

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::getEnormousString
          (TestMoreStuffImpl *this,GetEnormousStringContext context)

{
  long *in_RDX;
  PointerBuilder local_98;
  SegmentBuilder *local_78;
  CapTableBuilder *pCStack_70;
  WirePointer *local_68;
  undefined1 local_60;
  StructBuilder local_48;
  
  local_60 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_78);
  local_98.pointer = local_68;
  local_98.segment = local_78;
  local_98.capTable = pCStack_70;
  PointerBuilder::getStruct(&local_48,&local_98,(StructSize)0x10000,(word *)0x0);
  local_98.segment = local_48.segment;
  local_98.capTable = local_48.capTable;
  local_98.pointer = local_48.pointers;
  PointerBuilder::initBlob<capnp::Text>((Builder *)&local_78,&local_98,100000000);
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::getEnormousString(GetEnormousStringContext context) {
  context.getResults().initStr(100000000);  // 100MB
  return kj::READY_NOW;
}